

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O0

void uiter_setString_63(UCharIterator *iter,UChar *s,int32_t length)

{
  int32_t iVar1;
  int32_t length_local;
  UChar *s_local;
  UCharIterator *iter_local;
  
  if (iter != (UCharIterator *)0x0) {
    if ((s == (UChar *)0x0) || (length < -1)) {
      memcpy(iter,&noopIterator,0x70);
    }
    else {
      memcpy(iter,&stringIterator,0x70);
      iter->context = s;
      if (length < 0) {
        iVar1 = u_strlen_63(s);
        iter->length = iVar1;
      }
      else {
        iter->length = length;
      }
      iter->limit = iter->length;
    }
  }
  return;
}

Assistant:

U_CAPI void U_EXPORT2
uiter_setString(UCharIterator *iter, const UChar *s, int32_t length) {
    if(iter!=0) {
        if(s!=0 && length>=-1) {
            *iter=stringIterator;
            iter->context=s;
            if(length>=0) {
                iter->length=length;
            } else {
                iter->length=u_strlen(s);
            }
            iter->limit=iter->length;
        } else {
            *iter=noopIterator;
        }
    }
}